

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O2

void testHimmelblauFunctor(void)

{
  Status SVar1;
  ostream *poVar2;
  VectorXd z;
  VectorXd zInit;
  NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0> numDiff;
  DenseStorage<double,__1,__1,_1,_0> local_1d0;
  DenseStorage<double,__1,__1,_1,_0> local_1c0;
  NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0> local_1b0;
  DenseStorage<double,__1,__1,_1,_0> *local_1a0;
  LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  local_198;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Testing f(x,y) = (x^2 + y - 11)^2 + (x + y^2 - 7)^2 function...");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_198.parameters.factor = (double)CONCAT44(local_198.parameters.factor._4_4_,2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1c0,(int *)&local_198);
  local_1b0.super_HimmelblauFunctor.super_Functor<double,__1,__1>.m_inputs = 0;
  local_1b0.super_HimmelblauFunctor.super_Functor<double,__1,__1>.m_values = 0x3ff00000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_198,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_1c0,(Scalar *)&local_1b0);
  local_1d0.m_data = (double *)0xbff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_198,
             (Scalar *)&local_1d0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_198);
  poVar2 = std::operator<<((ostream *)&std::cout,"zInit: ");
  local_198.parameters.factor = (double)&local_1c0;
  poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&local_198);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"soln 1: [3.0, 2.0]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"soln 2: [-2.805118, 3.131312]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"soln 3: [-3.77931, -3.28316]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"soln 4: [3.584428, -1.848126]");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_1b0.super_HimmelblauFunctor.super_Functor<double,__1,__1>.m_inputs = 2;
  local_1b0.super_HimmelblauFunctor.super_Functor<double,__1,__1>.m_values = 2;
  local_1b0.epsfcn = 0.0;
  local_198.parameters.factor = 100.0;
  local_198.parameters.gtol = 0.0;
  local_198.parameters.epsfcn = 0.0;
  local_198.fvec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_198.fvec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  local_198.qtf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_198.qtf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_198.diag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_198.diag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  local_198.fjac.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_198.fjac.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  local_198.permutation.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  local_198.fjac.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  local_198.permutation.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (int *)0x0;
  local_198.nfev = 0;
  local_198.njev = 0;
  local_198.iter = 0;
  local_198.fnorm._0_1_ = 0;
  local_198.fnorm._1_7_ = 0;
  local_198.gnorm._0_1_ = 0;
  local_198._169_8_ = 0;
  local_198.wa1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_198.wa1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_198.wa2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_198.wa2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_198.wa3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_198.wa3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_198.wa4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_198.wa4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_198.parameters.maxfev = 1000;
  local_198.parameters.ftol = 1.4901161193847656e-08;
  local_198.parameters.xtol = 1e-10;
  local_198.functor = &local_1b0;
  poVar2 = std::operator<<((ostream *)&std::cout,"max fun eval: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"x tol: ");
  poVar2 = std::ostream::_M_insert<double>(local_198.parameters.xtol);
  std::endl<char,std::char_traits<char>>(poVar2);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1d0,&local_1c0);
  SVar1 = Eigen::
          LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>
          ::minimize(&local_198,(FVectorType *)&local_1d0);
  poVar2 = std::operator<<((ostream *)&std::cout,"iter count: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"return status: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,SVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"zSolver: ");
  local_1a0 = &local_1d0;
  poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&local_1a0);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~");
  std::endl<char,std::char_traits<char>>(poVar2);
  free(local_1d0.m_data);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>::
  ~LevenbergMarquardt(&local_198);
  free(local_1c0.m_data);
  return;
}

Assistant:

void testHimmelblauFunctor()
{
    std::cout << "Testing f(x,y) = (x^2 + y - 11)^2 + (x + y^2 - 7)^2 function..." << std::endl;
    // Eigen::VectorXd zInit(2); zInit << 0.0, 0.0;  // soln 1
    // Eigen::VectorXd zInit(2); zInit << -1, 1;  // soln 2
    // Eigen::VectorXd zInit(2); zInit << -1, -1;  // soln 3
    Eigen::VectorXd zInit(2); zInit << 1, -1;  // soln 4
    std::cout << "zInit: " << zInit.transpose() << std::endl;
    std::cout << "soln 1: [3.0, 2.0]" << std::endl;
    std::cout << "soln 2: [-2.805118, 3.131312]" << std::endl;
    std::cout << "soln 3: [-3.77931, -3.28316]" << std::endl;
    std::cout << "soln 4: [3.584428, -1.848126]" << std::endl;

    HimmelblauFunctor functor;
    Eigen::NumericalDiff<HimmelblauFunctor> numDiff(functor);
    Eigen::LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor>,double> lm(numDiff);
    lm.parameters.maxfev = 1000;
    lm.parameters.xtol = 1.0e-10;
    std::cout << "max fun eval: " << lm.parameters.maxfev << std::endl;
    std::cout << "x tol: " << lm.parameters.xtol << std::endl;

    Eigen::VectorXd z = zInit;
    int ret = lm.minimize(z);
    std::cout << "iter count: " << lm.iter << std::endl;
    std::cout << "return status: " << ret << std::endl;
    std::cout << "zSolver: " << z.transpose() << std::endl;
    std::cout << "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~" << std::endl;
}